

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::Compilation::resolveDefParamsAndBinds()::BindEntry>::
emplace_back<slang::ast::Compilation::resolveDefParamsAndBinds()::BindEntry>
          (SmallVectorBase<slang::ast::Compilation::resolveDefParamsAndBinds()::BindEntry> *this,
          BindEntry *args)

{
  ulong uVar1;
  BindEntry *__result;
  reference extraout_RAX;
  reference extraout_RAX_00;
  reference pBVar2;
  BindEntry *__result_00;
  ulong uVar3;
  BindEntry *__last;
  BindEntry *__first;
  BindEntry *this_00;
  
  uVar1 = *(ulong *)(this + 8);
  this_00 = (BindEntry *)(*(long *)this + uVar1 * 0x80);
  if (uVar1 == *(ulong *)(this + 0x10)) {
    if (uVar1 == 0xffffffffffffff) {
      detail::throwLengthError();
    }
    uVar3 = uVar1 + 1;
    if (uVar1 + 1 < uVar1 * 2) {
      uVar3 = uVar1 * 2;
    }
    if (0xffffffffffffff - uVar1 < uVar1) {
      uVar3 = 0xffffffffffffff;
    }
    __result = (BindEntry *)operator_new(uVar3 << 7);
    ast::Compilation::resolveDefParamsAndBinds::BindEntry::BindEntry(__result + uVar1,args);
    __first = *(BindEntry **)this;
    __last = __first + *(long *)(this + 8);
    __result_00 = __result;
    if (__last != this_00) {
      std::
      uninitialized_move<slang::ast::Compilation::resolveDefParamsAndBinds()::BindEntry*,slang::ast::Compilation::resolveDefParamsAndBinds()::BindEntry*>
                (__first,this_00,__result);
      __last = (BindEntry *)(*(long *)(this + 8) * 0x80 + *(long *)this);
      __result_00 = __result + uVar1 + 1;
      __first = this_00;
    }
    std::
    uninitialized_move<slang::ast::Compilation::resolveDefParamsAndBinds()::BindEntry*,slang::ast::Compilation::resolveDefParamsAndBinds()::BindEntry*>
              (__first,__last,__result_00);
    SmallVectorBase<BindEntry>::cleanup((SmallVectorBase<BindEntry> *)this,(EVP_PKEY_CTX *)__last);
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    *(ulong *)(this + 0x10) = uVar3;
    *(BindEntry **)this = __result;
    pBVar2 = extraout_RAX_00;
  }
  else {
    ast::Compilation::resolveDefParamsAndBinds::BindEntry::BindEntry(this_00,args);
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    pBVar2 = extraout_RAX;
  }
  return pBVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }